

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void * __thiscall
google::protobuf::internal::ExtensionSet::MutableRawRepeatedField(ExtensionSet *this,int number)

{
  LogMessage *this_00;
  Extension *extension;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  LogMessage *in_stack_ffffffffffffff80;
  LogMessage *in_stack_ffffffffffffff90;
  ExtensionSet *in_stack_ffffffffffffff98;
  undefined1 local_50 [56];
  Extension *local_18;
  
  local_18 = FindOrNull(in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  if (local_18 == (Extension *)0x0) {
    LogMessage::LogMessage
              (in_stack_ffffffffffffff90,(LogLevel)((ulong)local_50 >> 0x20),
               (char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    LogMessage::operator<<
              (in_stack_ffffffffffffff80,
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    this_00 = LogMessage::operator<<
                        (in_stack_ffffffffffffff80,
                         (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    LogMessage::~LogMessage((LogMessage *)0x4a6796);
  }
  return (void *)(local_18->field_0).int64_value;
}

Assistant:

void* ExtensionSet::MutableRawRepeatedField(int number) {
  Extension* extension = FindOrNull(number);
  GOOGLE_CHECK(extension != NULL) << "Extension not found.";
  // We assume that all the RepeatedField<>* pointers have the same
  // size and alignment within the anonymous union in Extension.
  return extension->repeated_int32_value;
}